

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

string * string_strip(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  long lVar2;
  int iVar3;
  size_type sVar4;
  size_type sVar5;
  ulong uVar6;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar4 = str->_M_string_length;
  sVar5 = 0;
  uVar6 = sVar5;
  if (sVar4 != 0) {
    do {
      iVar3 = isspace((int)pcVar1[sVar5]);
      uVar6 = sVar5;
      if (iVar3 == 0) break;
      sVar5 = sVar5 + 1;
      uVar6 = sVar4;
    } while (sVar4 != sVar5);
  }
  do {
    if (sVar4 <= uVar6) break;
    lVar2 = sVar4 - 1;
    sVar4 = sVar4 - 1;
    iVar3 = isspace((int)pcVar1[lVar2]);
  } while (iVar3 != 0);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)str);
  return __return_storage_ptr__;
}

Assistant:

std::string string_strip(const std::string & str) {
    size_t start = 0;
    size_t end = str.size();
    while (start < end && std::isspace(str[start])) {
        start++;
    }
    while (end > start && std::isspace(str[end - 1])) {
        end--;
    }
    return str.substr(start, end - start);
}